

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase707::~TestCase707(TestCase707 *this)

{
  TestCase707 *this_local;
  
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Async, ArrayJoinVoid) {
  for (auto specificJoinPromisesOverload: {
    +[](kj::Array<kj::Promise<void>> promises) { return joinPromises(kj::mv(promises)); },
    +[](kj::Array<kj::Promise<void>> promises) { return joinPromisesFailFast(kj::mv(promises)); }
  }) {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto builder = heapArrayBuilder<Promise<void>>(3);
    builder.add(READY_NOW);
    builder.add(READY_NOW);
    builder.add(READY_NOW);

    Promise<void> promise = specificJoinPromisesOverload(builder.finish());

    promise.wait(waitScope);
  }
}